

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O2

void __thiscall
Assimp::Ogre::OgreXmlSerializer::ReadSkeleton(OgreXmlSerializer *this,Skeleton *skeleton)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  Logger *this_00;
  undefined4 extraout_var;
  DeadlyImportError *this_01;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  psVar3 = NextNode_abi_cxx11_(this);
  bVar1 = std::operator!=(psVar3,"skeleton");
  if (bVar1) {
    this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+(&local_70,"Root node is <",&this->m_currentNodeName);
    std::operator+(&local_90,&local_70,"> expecting <skeleton>");
    DeadlyImportError::DeadlyImportError(this_01,&local_90);
    __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = DefaultLogger::get();
  Logger::debug(this_00,"Reading Skeleton");
  iVar2 = (*this->m_reader->_vptr_IIrrXMLReader[7])(this->m_reader,"blendmode");
  if (CONCAT44(extraout_var,iVar2) != 0) {
    ReadAttribute<std::__cxx11::string>(&local_50,this,"blendmode");
    ToLower(&local_90,&local_50);
    bVar1 = std::operator==(&local_90,"cumulative");
    skeleton->blendMode = (uint)bVar1;
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
  }
  NextNode_abi_cxx11_(this);
  psVar3 = &this->m_currentNodeName;
  do {
    bVar1 = std::operator==(psVar3,"bones");
    if (!bVar1) {
      bVar1 = std::operator==(psVar3,"bonehierarchy");
      if (!bVar1) {
        bVar1 = std::operator==(psVar3,"animations");
        if (!bVar1) {
          bVar1 = std::operator==(psVar3,"animationlinks");
          if (!bVar1) {
            return;
          }
        }
      }
    }
    bVar1 = std::operator==(psVar3,"bones");
    if (bVar1) {
      ReadBones(this,skeleton);
    }
    else {
      bVar1 = std::operator==(psVar3,"bonehierarchy");
      if (bVar1) {
        ReadBoneHierarchy(this,skeleton);
      }
      else {
        bVar1 = std::operator==(psVar3,"animations");
        if (bVar1) {
          ReadAnimations(this,skeleton);
        }
        else {
          SkipCurrentNode_abi_cxx11_(this);
        }
      }
    }
  } while( true );
}

Assistant:

void OgreXmlSerializer::ReadSkeleton(Skeleton *skeleton)
{
    if (NextNode() != nnSkeleton) {
        throw DeadlyImportError("Root node is <" + m_currentNodeName + "> expecting <skeleton>");
    }

    ASSIMP_LOG_DEBUG("Reading Skeleton");

    // Optional blend mode from root node
    if (HasAttribute("blendmode")) {
        skeleton->blendMode = (ToLower(ReadAttribute<std::string>("blendmode")) == "cumulative"
            ? Skeleton::ANIMBLEND_CUMULATIVE : Skeleton::ANIMBLEND_AVERAGE);
    }

    NextNode();

    // Root level nodes
    while(m_currentNodeName == nnBones         ||
          m_currentNodeName == nnBoneHierarchy ||
          m_currentNodeName == nnAnimations    ||
          m_currentNodeName == nnAnimationLinks)
    {
        if (m_currentNodeName == nnBones)
            ReadBones(skeleton);
        else if (m_currentNodeName == nnBoneHierarchy)
            ReadBoneHierarchy(skeleton);
        else if (m_currentNodeName == nnAnimations)
            ReadAnimations(skeleton);
        else
            SkipCurrentNode();
    }
}